

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void augment_colors(char *colors,int **attr,int *nattr)

{
  int iVar1;
  size_t sVar2;
  int *__dest;
  int iVar3;
  
  sVar2 = strlen(colors);
  iVar3 = (int)sVar2;
  if (*nattr < iVar3) {
    __dest = (int *)mem_alloc((long)iVar3 << 2);
    if (0 < (long)*nattr) {
      memcpy(__dest,*attr,(long)*nattr << 2);
    }
    mem_free(*attr);
    iVar1 = *nattr;
    convert_chars_to_attrs(colors + iVar1,iVar3 - iVar1,__dest + iVar1);
    *attr = __dest;
    *nattr = iVar3;
  }
  return;
}

Assistant:

static void augment_colors(const char *colors, int **attr, int *nattr)
{
	int n = (int) strlen(colors);

	if (*nattr < n) {
		int *newattr = mem_alloc(sizeof(*newattr) * n);

		if (*nattr > 0) {
			(void) memcpy(newattr, *attr, *nattr *
				sizeof(*newattr));
		}
		mem_free(*attr);
		convert_chars_to_attrs(colors + *nattr, n - *nattr,
			newattr + *nattr);
		*attr = newattr;
		*nattr = n;
	}
}